

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_delay_process_pcm_frames
                    (ma_delay *pDelay,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  uint uVar1;
  void *pvStack_48;
  ma_uint32 iBuffer;
  float *pFramesInF32;
  float *pFramesOutF32;
  uint local_30;
  ma_uint32 iChannel;
  ma_uint32 iFrame;
  ma_uint32 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_delay *pDelay_local;
  
  if (((pDelay == (ma_delay *)0x0) || (pFramesOut == (void *)0x0)) || (pFramesIn == (void *)0x0)) {
    pDelay_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    pvStack_48 = pFramesIn;
    pFramesInF32 = (float *)pFramesOut;
    for (local_30 = 0; local_30 < frameCount; local_30 = local_30 + 1) {
      for (pFramesOutF32._4_4_ = 0; pFramesOutF32._4_4_ < (pDelay->config).channels;
          pFramesOutF32._4_4_ = pFramesOutF32._4_4_ + 1) {
        uVar1 = pDelay->cursor * (pDelay->config).channels + pFramesOutF32._4_4_;
        if ((pDelay->config).delayStart == 0) {
          pDelay->pBuffer[uVar1] =
               pDelay->pBuffer[uVar1] * (pDelay->config).decay +
               *(float *)((long)pvStack_48 + (ulong)pFramesOutF32._4_4_ * 4) * (pDelay->config).dry;
          pFramesInF32[pFramesOutF32._4_4_] = pDelay->pBuffer[uVar1] * (pDelay->config).wet;
        }
        else {
          pFramesInF32[pFramesOutF32._4_4_] = pDelay->pBuffer[uVar1] * (pDelay->config).wet;
          pDelay->pBuffer[uVar1] =
               pDelay->pBuffer[uVar1] * (pDelay->config).decay +
               *(float *)((long)pvStack_48 + (ulong)pFramesOutF32._4_4_ * 4) * (pDelay->config).dry;
        }
      }
      pDelay->cursor = (pDelay->cursor + 1) % pDelay->bufferSizeInFrames;
      pFramesInF32 = pFramesInF32 + (pDelay->config).channels;
      pvStack_48 = (void *)((long)pvStack_48 + (ulong)(pDelay->config).channels * 4);
    }
    pDelay_local._4_4_ = MA_SUCCESS;
  }
  return pDelay_local._4_4_;
}

Assistant:

MA_API ma_result ma_delay_process_pcm_frames(ma_delay* pDelay, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    ma_uint32 iFrame;
    ma_uint32 iChannel;
    float* pFramesOutF32 = (float*)pFramesOut;
    const float* pFramesInF32 = (const float*)pFramesIn;

    if (pDelay == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
        for (iChannel = 0; iChannel < pDelay->config.channels; iChannel += 1) {
            ma_uint32 iBuffer = (pDelay->cursor * pDelay->config.channels) + iChannel;

            if (pDelay->config.delayStart) {
                /* Delayed start. */

                /* Read */
                pFramesOutF32[iChannel] = pDelay->pBuffer[iBuffer] * pDelay->config.wet;

                /* Feedback */
                pDelay->pBuffer[iBuffer] = (pDelay->pBuffer[iBuffer] * pDelay->config.decay) + (pFramesInF32[iChannel] * pDelay->config.dry);
            } else {
                /* Immediate start */

                /* Feedback */
                pDelay->pBuffer[iBuffer] = (pDelay->pBuffer[iBuffer] * pDelay->config.decay) + (pFramesInF32[iChannel] * pDelay->config.dry);

                /* Read */
                pFramesOutF32[iChannel] = pDelay->pBuffer[iBuffer] * pDelay->config.wet;
            }
        }

        pDelay->cursor = (pDelay->cursor + 1) % pDelay->bufferSizeInFrames;

        pFramesOutF32 += pDelay->config.channels;
        pFramesInF32  += pDelay->config.channels;
    }

    return MA_SUCCESS;
}